

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

void monster_get_target_dist_grid(monster *mon,int *dist,loc_conflict *grid)

{
  int iVar1;
  _Bool _Var2;
  wchar_t wVar3;
  loc_conflict grid2;
  loc_conflict decoy;
  loc_conflict *grid_local;
  int *dist_local;
  monster *mon_local;
  
  _Var2 = monster_is_decoyed(mon);
  if (_Var2) {
    grid2 = (loc_conflict)cave_find_decoy(cave);
    if (dist != (int *)0x0) {
      wVar3 = distance(mon->grid,(loc)grid2);
      *dist = wVar3;
    }
    if (grid != (loc_conflict *)0x0) {
      *grid = grid2;
    }
  }
  else {
    if (dist != (int *)0x0) {
      *dist = (uint)mon->cdis;
    }
    if (grid != (loc_conflict *)0x0) {
      iVar1 = (player->grid).y;
      grid->x = (player->grid).x;
      grid->y = iVar1;
    }
  }
  return;
}

Assistant:

static void monster_get_target_dist_grid(struct monster *mon, int *dist,
										 struct loc *grid)
{
	if (monster_is_decoyed(mon)) {
		struct loc decoy = cave_find_decoy(cave);
		if (dist) {
			*dist = distance(mon->grid, decoy);
		}
		if (grid) {
			*grid = decoy;
		}
	} else {
		if (dist) {
			*dist = mon->cdis;
		}
		if (grid) {
			*grid = player->grid;
		}
	}
}